

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_utl.cc
# Opt level: O1

int asn1_enc_restore(int *len,uchar **out,ASN1_VALUE **pval,ASN1_ITEM *it)

{
  int iVar1;
  ASN1_ENCODING *pAVar2;
  
  pAVar2 = asn1_get_enc_ptr((ASN1_VALUE **)pval,(ASN1_ITEM *)it);
  iVar1 = 0;
  if ((pAVar2 != (ASN1_ENCODING *)0x0) && (iVar1 = 0, pAVar2->len != 0)) {
    if (out != (uchar **)0x0) {
      memcpy(*out,pAVar2->enc,pAVar2->len);
    }
    iVar1 = 1;
    if (len != (int *)0x0) {
      *len = (int)pAVar2->len;
    }
  }
  return iVar1;
}

Assistant:

int asn1_enc_restore(int *len, unsigned char **out, ASN1_VALUE **pval,
                     const ASN1_ITEM *it) {
  ASN1_ENCODING *enc = asn1_get_enc_ptr(pval, it);
  if (!enc || enc->len == 0) {
    return 0;
  }
  if (out) {
    OPENSSL_memcpy(*out, enc->enc, enc->len);
    *out += enc->len;
  }
  if (len) {
    *len = enc->len;
  }
  return 1;
}